

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_0::GetEnumValidationRange
               (EnumDescriptor *enum_type,int16_t *start,uint16_t *size)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  EnumValueDescriptor *pEVar4;
  long lVar5;
  reference pvVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  EnumDescriptor *local_150;
  anon_class_8_1_24043258 val;
  Storage local_140;
  
  if (enum_type->value_count_ + -1 == (int)enum_type->sequential_value_limit_) {
    pEVar4 = EnumDescriptor::value(enum_type,0);
    uVar9 = enum_type->value_count_;
    bVar12 = false;
    if ((pEVar4->number_ + 0x8000U | uVar9) < 0x10000) {
      *start = (int16_t)pEVar4->number_;
      *size = (uint16_t)uVar9;
      bVar12 = true;
    }
  }
  else {
    val.enum_type = &local_150;
    local_150 = enum_type;
    iVar2 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,0);
    iVar11 = local_150->value_count_;
    iVar10 = iVar2;
    for (iVar8 = 1; iVar8 < iVar11; iVar8 = iVar8 + 1) {
      iVar3 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar8);
      if (iVar3 < iVar10) {
        iVar10 = iVar3;
      }
      iVar3 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar8);
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
    }
    lVar5 = (long)iVar2 - (long)iVar10;
    if (lVar5 < local_150->value_count_) {
      bVar12 = false;
      if (((short)iVar10 == iVar10) && (uVar1 = lVar5 + 1, bVar12 = false, uVar1 < 0x10000)) {
        *start = (short)iVar10;
        *size = (uint16_t)uVar1;
        local_140.size_alloc_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        .super_Storage<unsigned_long,_0UL,_false>.value =
             (CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
              )(lVar5 + 0x40U >> 6);
        local_140.data_ =
             absl::lts_20240722::
             FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::
             Storage::InitializeData(&local_140);
        for (lVar5 = 0;
            (long)local_140.size_alloc_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                  .super_Storage<unsigned_long,_0UL,_false>.value << 3 != lVar5; lVar5 = lVar5 + 8)
        {
          *(undefined8 *)((long)local_140.data_ + lVar5) = 0;
        }
        iVar11 = local_150->value_count_;
        uVar9 = 0;
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        for (iVar8 = 0; iVar11 != iVar8; iVar8 = iVar8 + 1) {
          iVar2 = GetEnumValidationRangeSlow::anon_class_8_1_24043258::operator()(&val,iVar8);
          uVar7 = (ulong)(iVar2 - iVar10);
          pvVar6 = absl::lts_20240722::
                   FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                   ::operator[]((FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>
                                 *)&local_140,uVar7 >> 6);
          uVar9 = (uVar9 + 1) - (uint)((*pvVar6 >> (uVar7 & 0x3f) & 1) != 0);
          *pvVar6 = *pvVar6 | 1L << (uVar7 & 0x3f);
        }
        bVar12 = uVar1 == uVar9;
        absl::lts_20240722::
        FixedArray<unsigned_long,_18446744073709551615UL,_std::allocator<unsigned_long>_>::Storage::
        ~Storage(&local_140);
      }
    }
    else {
      bVar12 = false;
    }
  }
  return bVar12;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int16_t& start,
                            uint16_t& size) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, start, size);
  }

  return SetEnumValidationRange(enum_type->value(0)->number(),
                                enum_type->value_count(), start, size);
}